

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O3

void __thiscall
flow::lang::LiteralExpr<flow::util::IPAddress>::LiteralExpr
          (LiteralExpr<flow::util::IPAddress> *this)

{
  undefined1 local_78 [16];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 local_4d;
  undefined8 uStack_45;
  undefined8 local_3d;
  undefined8 uStack_35;
  undefined8 uStack_2d;
  undefined5 uStack_25;
  undefined3 local_20;
  undefined5 uStack_1d;
  undefined8 uStack_18;
  
  local_20 = 0;
  uStack_1d = 0;
  uStack_18 = 0;
  local_78[0] = 0;
  local_68 = 1;
  uStack_64 = 1;
  uStack_60 = 0;
  uStack_5c = 1;
  local_58 = 1;
  (this->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001937f0;
  (this->super_Expr).super_ASTNode.location_.filename._M_dataplus._M_p =
       (pointer)&(this->super_Expr).super_ASTNode.location_.filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Expr).super_ASTNode.location_,local_78,local_78);
  (this->super_Expr).super_ASTNode.location_.end.column = (undefined4)local_58;
  (this->super_Expr).super_ASTNode.location_.end.offset = local_58._4_4_;
  (this->super_Expr).super_ASTNode.location_.begin.line = local_68;
  (this->super_Expr).super_ASTNode.location_.begin.column = uStack_64;
  *(ulong *)&(this->super_Expr).super_ASTNode.location_.begin.offset = CONCAT44(uStack_5c,uStack_60)
  ;
  (this->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_00193908;
  (this->value_).family_ = V4;
  (this->value_).cstr_[0] = '\0';
  *(ulong *)(this->value_).buf_ = CONCAT53(uStack_1d,local_20);
  *(undefined8 *)((this->value_).buf_ + 8) = uStack_18;
  *(undefined8 *)((this->value_).cstr_ + 0x21) = uStack_2d;
  *(ulong *)((this->value_).cstr_ + 0x29) = CONCAT35(local_20,uStack_25);
  *(undefined8 *)((this->value_).cstr_ + 0x11) = local_3d;
  *(undefined8 *)((this->value_).cstr_ + 0x19) = uStack_35;
  *(undefined8 *)((this->value_).cstr_ + 1) = local_4d;
  *(undefined8 *)((this->value_).cstr_ + 9) = uStack_45;
  return;
}

Assistant:

LiteralExpr() : LiteralExpr(T(), SourceLocation()) {}